

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O1

Matcher<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_&>
* testing::internal::
  MatcherCastImpl<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_&,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>
  ::CastImpl(Matcher<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_&>
             *__return_storage_ptr__,long *value)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>
  local_50;
  
  paVar1 = &local_50.first.field_2;
  local_50.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_50,*value,value[1] + *value);
  local_50.second.addr.a_.a_ = (address)value[4];
  local_50.second.size = value[5];
  Matcher<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_&>
  ::Matcher(__return_storage_ptr__,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_50.first._M_dataplus._M_p,local_50.first.field_2._M_allocated_capacity + 1
                   );
  }
  return __return_storage_ptr__;
}

Assistant:

static Matcher<T> CastImpl(const M& value,
                             std::false_type /* convertible_to_matcher */,
                             std::true_type /* convertible_to_T */) {
    return Matcher<T>(ImplicitCast_<T>(value));
  }